

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_foreach(CuTest *tc)

{
  undefined8 local_28;
  char *prev;
  int counter;
  int result;
  critbit_tree cb;
  CuTest *tc_local;
  
  cb.root = tc;
  memset(&counter,0,8);
  prev._0_4_ = 0;
  prev._4_4_ = cb_foreach((critbit_tree *)&counter,"herpderp",8,count_cb,&prev);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd5,(char *)0x0,0,prev._4_4_);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd6,(char *)0x0,0,(int)prev);
  prev._4_4_ = cb_insert((critbit_tree *)&counter,"herp",5);
  prev._0_4_ = 0;
  prev._4_4_ = cb_foreach((critbit_tree *)&counter,"herpderp",8,count_cb,&prev);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xdd,(char *)0x0,0,prev._4_4_);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xde,(char *)0x0,0,(int)prev);
  prev._0_4_ = 0;
  prev._4_4_ = cb_foreach((critbit_tree *)&counter,"",0,count_cb,&prev);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xe2,(char *)0x0,0,prev._4_4_);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xe3,(char *)0x0,1,(int)prev);
  prev._4_4_ = cb_insert((critbit_tree *)&counter,"derp",5);
  prev._4_4_ = cb_insert((critbit_tree *)&counter,"herpes",7);
  prev._4_4_ = cb_insert((critbit_tree *)&counter,"herpderp",9);
  prev._0_4_ = 0;
  prev._4_4_ = cb_foreach((critbit_tree *)&counter,"",0,count_cb,&prev);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xeb,(char *)0x0,0,prev._4_4_);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xec,(char *)0x0,4,(int)prev);
  prev._0_4_ = 0;
  prev._4_4_ = cb_foreach((critbit_tree *)&counter,"herp",0,count_cb,&prev);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf0,(char *)0x0,0,prev._4_4_);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf1,(char *)0x0,4,(int)prev);
  local_28 = 0;
  prev._4_4_ = cb_foreach((critbit_tree *)&counter,"",0,ordered_cb,&local_28);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf6,(char *)0x0,0,prev._4_4_);
  return;
}

Assistant:

static void test_foreach(CuTest *tc) {
    int total = 0;
    struct selist *ql = NULL;
    selist_push(&ql, (void *)lipsum);
    selist_push(&ql, (void *)lipsum);
    selist_foreach_ex(ql, callback_ctx, &total);
    CuAssertIntEquals(tc, 76, total);
    selist_foreach(ql, callback);
    CuAssertIntEquals(tc, 152, g_total);
    selist_free(ql);
}